

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
 __thiscall ninx::parser::Parser::parse_if_statement(Parser *this)

{
  int iVar1;
  Parser *in_RSI;
  undefined1 local_a8 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_a0;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  else_body;
  __single_object elseif_case;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  elseif_body;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  elseif_condition;
  __single_object main_case;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  condition;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  cases;
  allocator local_39;
  string local_38;
  Parser *this_local;
  __single_object *if_condition;
  
  this_local = this;
  iVar1 = TokenReader::check_type(&in_RSI->reader,IF);
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Expected If statement",&local_39);
    generate_exception(in_RSI,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  TokenReader::get_token(&in_RSI->reader);
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
            *)&condition);
  parse_expression((Parser *)&body);
  parse_block((Parser *)&main_case);
  std::
  make_unique<ninx::parser::element::IfCase,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            (&elseif_condition,&body);
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::push_back((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
               *)&condition,(value_type *)&elseif_condition);
  while (iVar1 = TokenReader::check_type(&in_RSI->reader,ELSEIF), iVar1 == 1) {
    TokenReader::get_token(&in_RSI->reader);
    parse_expression((Parser *)&elseif_body);
    parse_block((Parser *)&elseif_case);
    std::
    make_unique<ninx::parser::element::IfCase,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              ((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)&else_body,&elseif_body);
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ::push_back((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                 *)&condition,(value_type *)&else_body);
    std::
    unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                 *)&else_body);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&elseif_case);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)&elseif_body);
  }
  std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>::
  unique_ptr<std::default_delete<ninx::parser::element::Block>,void>
            ((unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>
              *)&local_a0,(nullptr_t)0x0);
  iVar1 = TokenReader::check_type(&in_RSI->reader,ELSE);
  if (iVar1 == 1) {
    TokenReader::get_token(&in_RSI->reader);
    parse_block((Parser *)local_a8);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    operator=(&local_a0,
              (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
               *)local_a8);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_a8);
  }
  std::
  make_unique<ninx::parser::element::IfStatement,std::vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            ((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
              *)this,(unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                      *)&condition);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr(&local_a0);
  std::
  unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>::
  ~unique_ptr((unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
               *)&elseif_condition);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&main_case);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&body);
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
             *)&condition);
  return (__uniq_ptr_data<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IfStatement> ninx::parser::Parser::parse_if_statement() {
    if (reader.check_type(Type::IF) != 1) {
        generate_exception("Expected If statement");
    }
    reader.get_token();

    std::vector<std::unique_ptr<IfCase>> cases;

    // Parse the main condition
    auto condition {parse_expression()};
    auto body {parse_block()};
    auto main_case = std::make_unique<IfCase>(std::move(condition), std::move(body));
    cases.push_back(std::move(main_case));

    // Parse optional else if statements
    while(reader.check_type(Type::ELSEIF) == 1) {
        reader.get_token();

        auto elseif_condition {parse_expression()};
        auto elseif_body {parse_block()};
        auto elseif_case = std::make_unique<IfCase>(std::move(elseif_condition), std::move(elseif_body));
        cases.push_back(std::move(elseif_case));
    }

    // Parse optional else statement
    std::unique_ptr<Block> else_body {nullptr};
    if (reader.check_type(Type::ELSE) == 1){
        reader.get_token();

        else_body = parse_block();
    }


    auto if_condition = std::make_unique<IfStatement>(std::move(cases), std::move(else_body));

    return if_condition;
}